

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_specific.cpp
# Opt level: O0

int main(void)

{
  stCoEpoll_t *ctx;
  int local_bc;
  int i;
  stRoutineArgs_t args [10];
  
  for (local_bc = 0; local_bc < 10; local_bc = local_bc + 1) {
    *(int *)&args[local_bc].co = local_bc;
    co_create((stCoRoutine_t **)(&stack0xffffffffffffff48 + (long)local_bc * 0x10),
              (stCoRoutineAttr_t *)0x0,RoutineFunc,&stack0xffffffffffffff48 + (long)local_bc * 0x10)
    ;
    co_resume(*(stCoRoutine_t **)(&stack0xffffffffffffff48 + (long)local_bc * 0x10));
  }
  ctx = co_get_epoll_ct();
  co_eventloop(ctx,(pfn_co_eventloop_t)0x0,(void *)0x0);
  return 0;
}

Assistant:

int main()
{
	stRoutineArgs_t args[10];
	for (int i = 0; i < 10; i++)
	{
		args[i].routine_id = i;
		co_create(&args[i].co, NULL, RoutineFunc, (void*)&args[i]);
		co_resume(args[i].co);
	}
	co_eventloop(co_get_epoll_ct(), NULL, NULL);
	return 0;
}